

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int closeUnixFile(unqlite_file *id)

{
  int iVar1;
  int *piVar2;
  int err_1;
  int err;
  unixFile *pFile;
  unqlite_file *id_local;
  
  if (id != (unqlite_file *)0x0) {
    if (-1 < *(int *)((long)&id[2].pMethods + 4)) {
      iVar1 = close(*(int *)((long)&id[2].pMethods + 4));
      if (iVar1 != 0) {
        piVar2 = __errno_location();
        *(int *)((long)&id[3].pMethods + 4) = *piVar2;
        return -2;
      }
      *(undefined4 *)((long)&id[2].pMethods + 4) = 0xffffffff;
    }
    if ((-1 < *(int *)&id[2].pMethods) && (iVar1 = close(*(int *)&id[2].pMethods), iVar1 != 0)) {
      piVar2 = __errno_location();
      *(int *)((long)&id[3].pMethods + 4) = *piVar2;
      return -2;
    }
    unqlite_free(id[5].pMethods);
    SyZero(id,0x48);
  }
  return 0;
}

Assistant:

static int closeUnixFile(unqlite_file *id){
  unixFile *pFile = (unixFile*)id;
  if( pFile ){
    if( pFile->dirfd>=0 ){
      int err = close(pFile->dirfd);
      if( err ){
        pFile->lastErrno = errno;
        return UNQLITE_IOERR;
      }else{
        pFile->dirfd=-1;
      }
    }
    if( pFile->h>=0 ){
      int err = close(pFile->h);
      if( err ){
        pFile->lastErrno = errno;
        return UNQLITE_IOERR;
      }
    }
    unqlite_free(pFile->pUnused);
    SyZero(pFile,sizeof(unixFile));
  }
  return UNQLITE_OK;
}